

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O2

exr_result_t internal_exr_write_header(_internal_exr_context *ctxt)

{
  _internal_exr_part *p_Var1;
  exr_attribute_t *a_00;
  char *__s1;
  exr_result_t eVar2;
  int iVar3;
  uint uVar4;
  int a;
  long lVar5;
  uint8_t next_byte;
  uint64_t *local_48;
  long local_40;
  uint32_t magic_and_version [2];
  
  uVar4 = (uint)(ctxt->is_singlepart_tiled != '\0') * 0x200 +
          ((uint)(ctxt->has_nonimage_data != '\0') << 0xb |
          (uint)(0x1f < ctxt->max_name_length) << 10 | (uint)(ctxt->is_multipart != '\0') << 0xc) +
          2;
  magic_and_version[0] = 0x1312f76;
  local_48 = &ctxt->output_file_offset;
  magic_and_version[1] = uVar4;
  eVar2 = (*ctxt->do_write)(ctxt,magic_and_version,8,local_48);
  if (eVar2 == 0) {
    lVar5 = 0;
    eVar2 = 0;
    while (eVar2 == 0) {
      if (ctxt->num_parts <= lVar5) {
        if (ctxt->is_multipart != '\0') {
          next_byte = '\0';
          eVar2 = (*ctxt->do_write)(ctxt,&next_byte,1,local_48);
          return eVar2;
        }
        return 0;
      }
      p_Var1 = ctxt->parts[lVar5];
      local_40 = lVar5;
      if (ctxt->legacy_header == '\0') {
        lVar5 = 0;
        do {
          if ((p_Var1->attributes).num_attributes <= lVar5) goto LAB_0011b2f1;
          eVar2 = save_attr(ctxt,(p_Var1->attributes).entries[lVar5]);
          lVar5 = lVar5 + 1;
        } while (eVar2 == 0);
      }
      else {
        for (lVar5 = 0; lVar5 < (p_Var1->attributes).num_attributes; lVar5 = lVar5 + 1) {
          a_00 = (p_Var1->attributes).sorted_entries[lVar5];
          if (((uVar4 & 0x1800) == 0) && (ctxt->num_parts == 1)) {
            __s1 = a_00->name;
            iVar3 = strcmp(__s1,"type");
            if ((iVar3 != 0) && (iVar3 = strcmp(__s1,"name"), iVar3 != 0)) goto LAB_0011b2b8;
          }
          else {
LAB_0011b2b8:
            eVar2 = save_attr(ctxt,a_00);
            if (eVar2 != 0) goto LAB_0011b309;
          }
        }
LAB_0011b2f1:
        next_byte = '\0';
        eVar2 = (*ctxt->do_write)(ctxt,&next_byte,1,local_48);
      }
LAB_0011b309:
      lVar5 = local_40 + 1;
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
internal_exr_write_header (struct _internal_exr_context* ctxt)
{
    exr_result_t rv;
    uint32_t     magic_and_version[2];
    uint32_t     flags;
    uint8_t      next_byte;

    flags = 2; // EXR_VERSION
    if (ctxt->is_multipart) flags |= EXR_MULTI_PART_FLAG;
    if (ctxt->max_name_length > EXR_SHORTNAME_MAXLEN)
        flags |= EXR_LONG_NAMES_FLAG;
    if (ctxt->has_nonimage_data) flags |= EXR_NON_IMAGE_FLAG;
    if (ctxt->is_singlepart_tiled) flags |= EXR_TILED_FLAG;

    magic_and_version[0] = 20000630;
    magic_and_version[1] = flags;

    priv_from_native32 (magic_and_version, 2);

    rv = ctxt->do_write (
        ctxt,
        magic_and_version,
        sizeof (uint32_t) * 2,
        &(ctxt->output_file_offset));
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        struct _internal_exr_part* curp = ctxt->parts[p];
        if (ctxt->legacy_header)
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                exr_attribute_t *curattr = curp->attributes.sorted_entries[a];
                if (0 == (flags & (EXR_MULTI_PART_FLAG |EXR_NON_IMAGE_FLAG)) &&
                    1 == ctxt->num_parts)
                {
                    if (0 == strcmp (curattr->name, "type") ||
                        0 == strcmp (curattr->name, "name"))
                    {
                        /* old file wouldn't have had this */
                        continue;
                    }
                }
                rv = save_attr (ctxt, curattr);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }
        else
        {
            for (int a = 0; a < curp->attributes.num_attributes; ++a)
            {
                rv = save_attr (ctxt, curp->attributes.entries[a]);
                if (rv != EXR_ERR_SUCCESS) break;
            }
        }

        /* indicate this part is finished */
        if (rv == EXR_ERR_SUCCESS)
        {
            next_byte = 0;
            rv        = ctxt->do_write (
                ctxt,
                &next_byte,
                sizeof (uint8_t),
                &(ctxt->output_file_offset));
        }
    }

    /* for multipart write a double terminator at the end */
    if (rv == EXR_ERR_SUCCESS && ctxt->is_multipart)
    {
        next_byte = 0;
        rv        = ctxt->do_write (
            ctxt, &next_byte, sizeof (uint8_t), &(ctxt->output_file_offset));
    }

    return rv;
}